

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int gz_load(gz_statep state,uchar *buf,uint len,uint *have)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *msg;
  uint local_38;
  uint max;
  uint get;
  int ret;
  uint *have_local;
  uint len_local;
  uchar *buf_local;
  gz_statep state_local;
  
  *have = 0;
  do {
    local_38 = len - *have;
    if (0x40000000 < local_38) {
      local_38 = 0x40000000;
    }
    sVar2 = read(state->fd,buf + *have,(ulong)local_38);
    iVar1 = (int)sVar2;
  } while ((0 < iVar1) && (*have = iVar1 + *have, *have < len));
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    msg = strerror(*piVar3);
    gz_error(state,-1,msg);
    state_local._4_4_ = -1;
  }
  else {
    if (iVar1 == 0) {
      state->eof = 1;
    }
    state_local._4_4_ = 0;
  }
  return state_local._4_4_;
}

Assistant:

local int gz_load(gz_statep state, unsigned char *buf, unsigned len,
                  unsigned *have) {
    int ret;
    unsigned get, max = ((unsigned)-1 >> 2) + 1;

    *have = 0;
    do {
        get = len - *have;
        if (get > max)
            get = max;
        ret = read(state->fd, buf + *have, get);
        if (ret <= 0)
            break;
        *have += (unsigned)ret;
    } while (*have < len);
    if (ret < 0) {
        gz_error(state, Z_ERRNO, zstrerror());
        return -1;
    }
    if (ret == 0)
        state->eof = 1;
    return 0;
}